

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O3

int AF_AActor_CanSeek(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                     VMReturn *ret,int numret)

{
  int iVar1;
  undefined4 extraout_var;
  PClass *pPVar3;
  AActor *target;
  char *pcVar4;
  AActor *this;
  bool bVar5;
  PClass *pPVar2;
  undefined4 extraout_var_00;
  
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar4 = "(paramnum) < numparam";
    goto LAB_0042dc84;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_0042dc6b:
    pcVar4 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_0042dc84:
    __assert_fail(pcVar4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x7d5,"int AF_AActor_CanSeek(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  this = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (this == (AActor *)0x0) goto LAB_0042db87;
    pPVar2 = (this->super_DThinker).super_DObject.Class;
    if (pPVar2 == (PClass *)0x0) {
      iVar1 = (**(this->super_DThinker).super_DObject._vptr_DObject)(this);
      pPVar2 = (PClass *)CONCAT44(extraout_var,iVar1);
      (this->super_DThinker).super_DObject.Class = pPVar2;
    }
    bVar5 = pPVar2 != (PClass *)0x0;
    if (pPVar2 != pPVar3 && bVar5) {
      do {
        pPVar2 = pPVar2->ParentClass;
        bVar5 = pPVar2 != (PClass *)0x0;
        if (pPVar2 == pPVar3) break;
      } while (pPVar2 != (PClass *)0x0);
    }
    if (!bVar5) {
      pcVar4 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_0042dc84;
    }
  }
  else {
    if (this != (AActor *)0x0) goto LAB_0042dc6b;
LAB_0042db87:
    this = (AActor *)0x0;
  }
  if (numparam == 1) {
    pcVar4 = "(paramnum) < numparam";
    goto LAB_0042dcac;
  }
  if (param[1].field_0.field_3.Type != '\x03') {
LAB_0042dc74:
    pcVar4 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
    goto LAB_0042dcac;
  }
  target = (AActor *)param[1].field_0.field_1.a;
  if (param[1].field_0.field_1.atag == 1) {
    if (target == (AActor *)0x0) goto LAB_0042dbba;
  }
  else {
    if (target != (AActor *)0x0) goto LAB_0042dc74;
LAB_0042dbba:
    NullParam("\"target\"");
    target = (AActor *)param[1].field_0.field_1.a;
    if (target == (AActor *)0x0) {
      target = (AActor *)0x0;
      goto LAB_0042dc2f;
    }
  }
  pPVar2 = AActor::RegistrationInfo.MyClass;
  pPVar3 = (target->super_DThinker).super_DObject.Class;
  if (pPVar3 == (PClass *)0x0) {
    iVar1 = (**(target->super_DThinker).super_DObject._vptr_DObject)(target);
    pPVar3 = (PClass *)CONCAT44(extraout_var_00,iVar1);
    (target->super_DThinker).super_DObject.Class = pPVar3;
  }
  bVar5 = pPVar3 != (PClass *)0x0;
  if (pPVar3 != pPVar2 && bVar5) {
    do {
      pPVar3 = pPVar3->ParentClass;
      bVar5 = pPVar3 != (PClass *)0x0;
      if (pPVar3 == pPVar2) break;
    } while (pPVar3 != (PClass *)0x0);
  }
  if (!bVar5) {
    pcVar4 = "target == NULL || target->IsKindOf(RUNTIME_CLASS(AActor))";
LAB_0042dcac:
    __assert_fail(pcVar4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x7d6,"int AF_AActor_CanSeek(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
LAB_0042dc2f:
  bVar5 = AActor::CanSeek(this,target);
  if (numret < 1) {
    iVar1 = 0;
  }
  else {
    if (ret == (VMReturn *)0x0) {
      __assert_fail("ret != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                    ,0x7d7,
                    "int AF_AActor_CanSeek(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    if (ret->RegType != '\0') {
      __assert_fail("RegType == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/vm/vm.h"
                    ,0x13f,"void VMReturn::SetInt(int)");
    }
    *(uint *)ret->Location = (uint)bVar5;
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, CanSeek)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_OBJECT_NOT_NULL(target, AActor);
	ACTION_RETURN_BOOL(self->CanSeek(target));
}